

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall
server_response::remove_waiting_task_ids
          (server_response *this,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *id_tasks)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  common_log *log;
  size_type sVar4;
  undefined8 in_RSI;
  value_type_conflict *id_task;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range1;
  unique_lock<std::mutex> lock;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  unique_lock<std::mutex> *in_stack_ffffffffffffff90;
  _Node_iterator_base<int,_false> local_38;
  _Node_iterator_base<int,_false> local_30;
  undefined8 local_28;
  undefined8 local_10;
  
  local_10 = in_RSI;
  httplib::detail::std::unique_lock<std::mutex>::unique_lock
            (in_stack_ffffffffffffff90,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_28 = local_10;
  local_30._M_cur =
       (__node_type *)
       httplib::detail::std::
       unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::begin
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_38._M_cur =
       (__node_type *)
       httplib::detail::std::
       unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  while( true ) {
    bVar2 = httplib::detail::std::__detail::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    puVar3 = (uint *)httplib::detail::std::__detail::_Node_const_iterator<int,_true,_false>::
                     operator*((_Node_const_iterator<int,_true,_false> *)0x282900);
    if (0 < common_log_verbosity_thold) {
      log = common_log_main();
      uVar1 = *puVar3;
      sVar4 = httplib::detail::std::
              unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
                        ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                          *)0x28293a);
      in_stack_ffffffffffffff88 = (undefined4)sVar4;
      common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                     "srv  %12.*s: remove task %d from waiting list. current waiting = %d (before remove)\n"
                     ,0xc,"remove_waiting_task_ids",(ulong)uVar1);
    }
    httplib::detail::std::
    unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::erase
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               in_stack_ffffffffffffff90,
               (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    httplib::detail::std::__detail::_Node_const_iterator<int,_true,_false>::operator++
              ((_Node_const_iterator<int,_true,_false> *)in_stack_ffffffffffffff90);
  }
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void remove_waiting_task_ids(const std::unordered_set<int> & id_tasks) {
        std::unique_lock<std::mutex> lock(mutex_results);

        for (const auto & id_task : id_tasks) {
            SRV_DBG("remove task %d from waiting list. current waiting = %d (before remove)\n", id_task, (int) waiting_task_ids.size());
            waiting_task_ids.erase(id_task);
        }
    }